

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmcFault.c
# Opt level: O3

void Cnf_AddCardinConstrPairWise(sat_solver *p,Vec_Int_t *vVars,int K,int fStrict)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  int iVar4;
  int iVar5;
  int iVar6;
  int *piVar7;
  long lVar8;
  ulong uVar9;
  size_t __size;
  long lVar10;
  int iVar12;
  undefined1 auVar11 [16];
  undefined1 auVar13 [16];
  int iVar15;
  undefined1 auVar14 [16];
  int Lit;
  int nVars;
  int local_44;
  int local_40;
  int local_3c;
  long local_38;
  
  iVar4 = sat_solver_nvars(p);
  iVar6 = vVars->nSize;
  local_40 = iVar4;
  if ((long)iVar6 < 2) {
    __assert_fail("nSizeOld >= 2",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/sat/bmc/bmcFault.c"
                  ,0x73,"void Cnf_AddCardinConstrPairWise(sat_solver *, Vec_Int_t *, int, int)");
  }
  lVar8 = 0;
  do {
    if ((vVars->pArray[lVar8] < 0) || (iVar4 <= vVars->pArray[lVar8])) {
      __assert_fail("iVar >= 0 && iVar < nVars",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/sat/bmc/bmcFault.c"
                    ,0x76,"void Cnf_AddCardinConstrPairWise(sat_solver *, Vec_Int_t *, int, int)");
    }
    lVar8 = lVar8 + 1;
  } while (iVar6 != lVar8);
  iVar12 = 1;
  do {
    iVar5 = iVar12;
    iVar12 = iVar5 * 2;
  } while (iVar5 < iVar6);
  local_3c = fStrict;
  sat_solver_setnvars(p,iVar4 + ((uint)(iVar5 * iVar5) >> 1) + 1);
  if (iVar5 != iVar6) {
    iVar12 = vVars->nSize;
    if (iVar12 < iVar5) {
      iVar15 = vVars->nCap;
      lVar8 = (long)iVar15 * 2;
      if ((int)lVar8 < iVar5) {
        if (vVars->pArray == (int *)0x0) {
          piVar7 = (int *)malloc((long)iVar5 << 2);
        }
        else {
          piVar7 = (int *)realloc(vVars->pArray,(long)iVar5 << 2);
        }
        vVars->pArray = piVar7;
        iVar12 = iVar5;
joined_r0x00537672:
        if (piVar7 == (int *)0x0) {
          __assert_fail("p->pArray",
                        "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecInt.h"
                        ,0x20c,"void Vec_IntGrow(Vec_Int_t *, int)");
        }
        vVars->nCap = iVar12;
        iVar12 = vVars->nSize;
      }
      else if (iVar15 < iVar5) {
        __size = (long)iVar15 << 3;
        local_38 = lVar8;
        if (vVars->pArray == (int *)0x0) {
          piVar7 = (int *)malloc(__size);
        }
        else {
          piVar7 = (int *)realloc(vVars->pArray,__size);
        }
        vVars->pArray = piVar7;
        iVar12 = (int)local_38;
        goto joined_r0x00537672;
      }
      auVar3 = _DAT_008403e0;
      auVar2 = _DAT_008403d0;
      auVar1 = _DAT_008403c0;
      if (iVar12 < iVar5) {
        piVar7 = vVars->pArray;
        lVar8 = (long)iVar12;
        lVar10 = (iVar5 - lVar8) + -1;
        auVar11._8_4_ = (int)lVar10;
        auVar11._0_8_ = lVar10;
        auVar11._12_4_ = (int)((ulong)lVar10 >> 0x20);
        uVar9 = 0;
        auVar11 = auVar11 ^ _DAT_008403e0;
        do {
          auVar13._8_4_ = (int)uVar9;
          auVar13._0_8_ = uVar9;
          auVar13._12_4_ = (int)(uVar9 >> 0x20);
          auVar14 = (auVar13 | auVar2) ^ auVar3;
          iVar12 = auVar11._4_4_;
          if ((bool)(~(auVar14._4_4_ == iVar12 && auVar11._0_4_ < auVar14._0_4_ ||
                      iVar12 < auVar14._4_4_) & 1)) {
            piVar7[lVar8 + uVar9] = iVar4;
          }
          if ((auVar14._12_4_ != auVar11._12_4_ || auVar14._8_4_ <= auVar11._8_4_) &&
              auVar14._12_4_ <= auVar11._12_4_) {
            piVar7[lVar8 + uVar9 + 1] = iVar4;
          }
          auVar13 = (auVar13 | auVar1) ^ auVar3;
          iVar15 = auVar13._4_4_;
          if (iVar15 <= iVar12 && (iVar15 != iVar12 || auVar13._0_4_ <= auVar11._0_4_)) {
            piVar7[lVar8 + uVar9 + 2] = iVar4;
            piVar7[lVar8 + uVar9 + 3] = iVar4;
          }
          uVar9 = uVar9 + 4;
        } while (((iVar5 - lVar8) + 3U & 0xfffffffffffffffc) != uVar9);
      }
      vVars->nSize = iVar5;
    }
    local_40 = iVar4 + 1;
    local_44 = iVar4 * 2 + 1;
    iVar4 = sat_solver_addclause(p,&local_44,&local_40);
    if (iVar4 == 0) {
      __assert_fail("0",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/sat/bmc/bmcFault.c"
                    ,0x82,"void Cnf_AddCardinConstrPairWise(sat_solver *, Vec_Int_t *, int, int)");
    }
  }
  Cnf_AddCardinConstrRange(p,vVars->pArray,0,iVar5 + -1,&local_40);
  iVar4 = local_3c;
  if ((K < 1) || (iVar6 <= K)) {
    __assert_fail("K > 0 && K < nSizeOld",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/sat/bmc/bmcFault.c"
                  ,0x88,"void Cnf_AddCardinConstrPairWise(sat_solver *, Vec_Int_t *, int, int)");
  }
  if (vVars->nSize <= K) {
LAB_005376b6:
    __assert_fail("i >= 0 && i < p->nSize",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecInt.h"
                  ,0x19e,"int Vec_IntEntry(Vec_Int_t *, int)");
  }
  if (vVars->pArray[(uint)K] < 0) {
LAB_005376d5:
    __assert_fail("Var >= 0 && !(c >> 1)",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/util/abc_global.h"
                  ,0xf1,"int Abc_Var2Lit(int, int)");
  }
  local_44 = vVars->pArray[(uint)K] * 2 + 1;
  iVar6 = sat_solver_addclause(p,&local_44,&local_40);
  if (iVar6 == 0) {
    __assert_fail("0",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/sat/bmc/bmcFault.c"
                  ,0x8b,"void Cnf_AddCardinConstrPairWise(sat_solver *, Vec_Int_t *, int, int)");
  }
  if (iVar4 != 0) {
    if (vVars->nSize < K) goto LAB_005376b6;
    if (vVars->pArray[(ulong)(uint)K - 1] < 0) goto LAB_005376d5;
    local_44 = vVars->pArray[(ulong)(uint)K - 1] * 2;
    iVar6 = sat_solver_addclause(p,&local_44,&local_40);
    if (iVar6 == 0) {
      __assert_fail("0",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/sat/bmc/bmcFault.c"
                    ,0x90,"void Cnf_AddCardinConstrPairWise(sat_solver *, Vec_Int_t *, int, int)");
    }
  }
  if (vVars->nSize < 0) {
    __assert_fail("p->nSize >= nSizeNew",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecInt.h"
                  ,0x2ac,"void Vec_IntShrink(Vec_Int_t *, int)");
  }
  vVars->nSize = 0;
  return;
}

Assistant:

void Cnf_AddCardinConstrPairWise( sat_solver * p, Vec_Int_t * vVars, int K, int fStrict )
{
    int nVars = sat_solver_nvars(p);
    int nSizeOld = Vec_IntSize(vVars);
    int i, iVar, nSize, Lit, nVarsOld;
    assert( nSizeOld >= 2 );
    // check that vars are ok
    Vec_IntForEachEntry( vVars, iVar, i )
        assert( iVar >= 0 && iVar < nVars );
    // make the size a degree of two
    for ( nSize = 1; nSize < nSizeOld; nSize *= 2 );
    // extend
    sat_solver_setnvars( p, nVars + 1 + nSize * nSize / 2 );
    if ( nSize != nSizeOld )
    {
        // fill in with const0
        Vec_IntFillExtra( vVars, nSize, nVars );
        // add const0 variable
        Lit = Abc_Var2Lit( nVars++, 1 );
        if ( !sat_solver_addclause( p, &Lit, &Lit+1 ) )
            assert( 0 );
    }
    // construct recursively
    nVarsOld = nVars;
    Cnf_AddCardinConstrRange( p, Vec_IntArray(vVars), 0, nSize - 1, &nVars );
    // add final constraint
    assert( K > 0 && K < nSizeOld );
    Lit = Abc_Var2Lit( Vec_IntEntry(vVars, K), 1 );
    if ( !sat_solver_addclause( p, &Lit, &Lit+1 ) )
        assert( 0 );
    if ( fStrict )
    {
        Lit = Abc_Var2Lit( Vec_IntEntry(vVars, K-1), 0 );
        if ( !sat_solver_addclause( p, &Lit, &Lit+1 ) )
            assert( 0 );
    }
    // return to the old size
    Vec_IntShrink( vVars, 0 ); // make it unusable
    //printf( "The %d input sorting network contains %d sorters.\n", nSize, (nVars - nVarsOld)/2 );
}